

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O0

int64_t HighsIntegers::gcd(int64_t a,int64_t b)

{
  long lVar1;
  int64_t h;
  int64_t b_local;
  int64_t a_local;
  undefined8 local_8;
  
  a_local = a;
  if (a < 0) {
    a_local = -a;
  }
  b_local = b;
  if (b < 0) {
    b_local = -b;
  }
  if (a_local == 0) {
    local_8 = b_local;
  }
  else {
    lVar1 = b_local;
    if (b_local == 0) {
      local_8 = a_local;
    }
    else {
      do {
        b_local = lVar1;
        lVar1 = a_local % b_local;
        a_local = b_local;
      } while (lVar1 != 0);
      local_8 = b_local;
    }
  }
  return local_8;
}

Assistant:

static int64_t gcd(int64_t a, int64_t b) {
    assert(a != std::numeric_limits<int64_t>::min());
    assert(b != std::numeric_limits<int64_t>::min());

    int64_t h;
    if (a < 0) a = -a;
    if (b < 0) b = -b;

    if (a == 0) return b;
    if (b == 0) return a;

    do {
      h = a % b;
      a = b;
      b = h;
    } while (b != 0);

    return a;
  }